

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::declarationList(GrpParser *this)

{
  ASTFactory *this_00;
  uint uVar1;
  RefAST *this_01;
  RefAST *child;
  RefAST declarationList_AST;
  ASTPair currentAST;
  RefAST local_40;
  RefAST local_38;
  
  this_01 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_01,&nullAST);
  declarationList_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  this_00 = &(this->super_LLkParser).super_Parser.astFactory;
  while( true ) {
    uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (0x39 < uVar1) break;
    if ((0x200000000802000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((0x4200UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) break;
      topDecl(this);
      local_40.ref = this_01->ref;
      if (local_40.ref != (Ref *)0x0) {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      child = &local_40;
      ASTFactory::addASTChild(this_00,&currentAST,child);
    }
    else {
      globalDecl(this);
      local_38.ref = this_01->ref;
      if (local_38.ref != (Ref *)0x0) {
        (local_38.ref)->count = (local_38.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_00,&currentAST,&local_38);
      child = &local_38;
    }
    RefCount<AST>::~RefCount(child);
  }
  RefCount<AST>::operator=(&declarationList_AST,&currentAST.root);
  RefCount<AST>::operator=(this_01,&declarationList_AST);
  RefCount<AST>::~RefCount(&declarationList_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::declarationList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST declarationList_AST = nullAST;
	
	try {      // for error handling
		{
		do {
			switch ( LA(1)) {
			case IDENT:
			case LITERAL_glyph:
			case LITERAL_position:
			{
				globalDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_environment:
			case LITERAL_table:
			{
				topDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop4;
			}
			}
		} while (true);
		_loop4:;
		}
		declarationList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_0);
	}
	returnAST = declarationList_AST;
}